

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

double __thiscall el::Logger::log(Logger *this,double __x)

{
  ostream *in_RSI;
  double extraout_XMM0_Qa;
  
  std::operator<<(in_RSI,(this->m_id)._M_dataplus._M_p);
  return extraout_XMM0_Qa;
}

Assistant:

virtual inline void log(el::base::type::ostream_t& os) const {
    os << m_id.c_str();
  }